

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O1

void av1_build_compound_diffwtd_mask_highbd_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  int iVar4;
  int j;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  
  if (w < 0x10) {
    av1_build_compound_diffwtd_mask_highbd_ssse3
              (mask,mask_type,src0,src0_stride,src1,src1_stride,h,w,bd);
    return;
  }
  lVar2 = (long)src0 * 2;
  lVar3 = (long)src1 * 2;
  if (bd == 8) {
    if (mask_type == '\x01') {
      if (0 < h) {
        iVar4 = 0;
        auVar7._8_2_ = 0xffda;
        auVar7._0_8_ = 0xffdaffdaffdaffda;
        auVar7._10_2_ = 0xffda;
        auVar7._12_2_ = 0xffda;
        auVar7._14_2_ = 0xffda;
        auVar7._16_2_ = 0xffda;
        auVar7._18_2_ = 0xffda;
        auVar7._20_2_ = 0xffda;
        auVar7._22_2_ = 0xffda;
        auVar7._24_2_ = 0xffda;
        auVar7._26_2_ = 0xffda;
        auVar7._28_2_ = 0xffda;
        auVar7._30_2_ = 0xffda;
        auVar9._8_2_ = 0x1a;
        auVar9._0_8_ = 0x1a001a001a001a;
        auVar9._10_2_ = 0x1a;
        auVar9._12_2_ = 0x1a;
        auVar9._14_2_ = 0x1a;
        auVar9._16_2_ = 0x1a;
        auVar9._18_2_ = 0x1a;
        auVar9._20_2_ = 0x1a;
        auVar9._22_2_ = 0x1a;
        auVar9._24_2_ = 0x1a;
        auVar9._26_2_ = 0x1a;
        auVar9._28_2_ = 0x1a;
        auVar9._30_2_ = 0x1a;
        do {
          uVar5 = 0;
          do {
            auVar12 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar5 * 2),
                                  *(undefined1 (*) [32])(lVar3 + uVar5 * 2));
            auVar12 = vpabsw_avx2(auVar12);
            auVar12 = vpsraw_avx2(auVar12,4);
            auVar12 = vpmaxsw_avx2(auVar12,auVar7);
            auVar12 = vpminsw_avx2(auVar12,auVar9);
            auVar12 = vpsubw_avx2(auVar9,auVar12);
            auVar6 = vpackuswb_avx(auVar12._0_16_,auVar12._16_16_);
            *(undefined1 (*) [16])(mask + uVar5) = auVar6;
            uVar5 = uVar5 + 0x10;
          } while (uVar5 < (uint)w);
          mask = mask + (uint)w;
          iVar4 = iVar4 + 1;
          lVar3 = lVar3 + (long)src1_stride * 2;
          lVar2 = lVar2 + (long)src0_stride * 2;
        } while (iVar4 != h);
      }
    }
    else if (0 < h) {
      iVar4 = 0;
      auVar8._8_2_ = 0xffda;
      auVar8._0_8_ = 0xffdaffdaffdaffda;
      auVar8._10_2_ = 0xffda;
      auVar8._12_2_ = 0xffda;
      auVar8._14_2_ = 0xffda;
      auVar8._16_2_ = 0xffda;
      auVar8._18_2_ = 0xffda;
      auVar8._20_2_ = 0xffda;
      auVar8._22_2_ = 0xffda;
      auVar8._24_2_ = 0xffda;
      auVar8._26_2_ = 0xffda;
      auVar8._28_2_ = 0xffda;
      auVar8._30_2_ = 0xffda;
      auVar11._8_2_ = 0x1a;
      auVar11._0_8_ = 0x1a001a001a001a;
      auVar11._10_2_ = 0x1a;
      auVar11._12_2_ = 0x1a;
      auVar11._14_2_ = 0x1a;
      auVar11._16_2_ = 0x1a;
      auVar11._18_2_ = 0x1a;
      auVar11._20_2_ = 0x1a;
      auVar11._22_2_ = 0x1a;
      auVar11._24_2_ = 0x1a;
      auVar11._26_2_ = 0x1a;
      auVar11._28_2_ = 0x1a;
      auVar11._30_2_ = 0x1a;
      auVar13._8_2_ = 0x26;
      auVar13._0_8_ = 0x26002600260026;
      auVar13._10_2_ = 0x26;
      auVar13._12_2_ = 0x26;
      auVar13._14_2_ = 0x26;
      auVar13._16_2_ = 0x26;
      auVar13._18_2_ = 0x26;
      auVar13._20_2_ = 0x26;
      auVar13._22_2_ = 0x26;
      auVar13._24_2_ = 0x26;
      auVar13._26_2_ = 0x26;
      auVar13._28_2_ = 0x26;
      auVar13._30_2_ = 0x26;
      do {
        uVar5 = 0;
        do {
          auVar12 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar5 * 2),
                                *(undefined1 (*) [32])(lVar3 + uVar5 * 2));
          auVar12 = vpabsw_avx2(auVar12);
          auVar12 = vpsraw_avx2(auVar12,4);
          auVar12 = vpmaxsw_avx2(auVar12,auVar8);
          auVar12 = vpminsw_avx2(auVar12,auVar11);
          auVar12 = vpaddw_avx2(auVar12,auVar13);
          auVar6 = vpackuswb_avx(auVar12._0_16_,auVar12._16_16_);
          *(undefined1 (*) [16])(mask + uVar5) = auVar6;
          uVar5 = uVar5 + 0x10;
        } while (uVar5 < (uint)w);
        mask = mask + (uint)w;
        iVar4 = iVar4 + 1;
        lVar3 = lVar3 + (long)src1_stride * 2;
        lVar2 = lVar2 + (long)src0_stride * 2;
      } while (iVar4 != h);
    }
  }
  else {
    auVar6._8_8_ = (long)(bd + -4);
    auVar6._0_8_ = (long)(bd + -4);
    if (mask_type == '\x01') {
      if (0 < h) {
        auVar10._8_2_ = 0x26;
        auVar10._0_8_ = 0x26002600260026;
        auVar10._10_2_ = 0x26;
        auVar10._12_2_ = 0x26;
        auVar10._14_2_ = 0x26;
        auVar10._16_2_ = 0x26;
        auVar10._18_2_ = 0x26;
        auVar10._20_2_ = 0x26;
        auVar10._22_2_ = 0x26;
        auVar10._24_2_ = 0x26;
        auVar10._26_2_ = 0x26;
        auVar10._28_2_ = 0x26;
        auVar10._30_2_ = 0x26;
        iVar4 = 0;
        auVar14._8_2_ = 0x40;
        auVar14._0_8_ = 0x40004000400040;
        auVar14._10_2_ = 0x40;
        auVar14._12_2_ = 0x40;
        auVar14._14_2_ = 0x40;
        auVar14._16_2_ = 0x40;
        auVar14._18_2_ = 0x40;
        auVar14._20_2_ = 0x40;
        auVar14._22_2_ = 0x40;
        auVar14._24_2_ = 0x40;
        auVar14._26_2_ = 0x40;
        auVar14._28_2_ = 0x40;
        auVar14._30_2_ = 0x40;
        do {
          uVar5 = 0;
          do {
            auVar12 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar5 * 2),
                                  *(undefined1 (*) [32])(lVar3 + uVar5 * 2));
            auVar12 = vpabsw_avx2(auVar12);
            auVar12 = vpsraw_avx2(auVar12,auVar6);
            auVar12 = vpaddw_avx2(auVar12,auVar10);
            auVar12 = vpmaxsw_avx2(auVar12,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar12 = vpminsw_avx2(auVar12,auVar14);
            auVar12 = vpsubw_avx2(auVar14,auVar12);
            auVar1 = vpackuswb_avx(auVar12._0_16_,auVar12._16_16_);
            *(undefined1 (*) [16])(mask + uVar5) = auVar1;
            uVar5 = uVar5 + 0x10;
          } while (uVar5 < (uint)w);
          mask = mask + (uint)w;
          iVar4 = iVar4 + 1;
          lVar3 = lVar3 + (long)src1_stride * 2;
          lVar2 = lVar2 + (long)src0_stride * 2;
        } while (iVar4 != h);
      }
    }
    else if (0 < h) {
      auVar12._8_2_ = 0x26;
      auVar12._0_8_ = 0x26002600260026;
      auVar12._10_2_ = 0x26;
      auVar12._12_2_ = 0x26;
      auVar12._14_2_ = 0x26;
      auVar12._16_2_ = 0x26;
      auVar12._18_2_ = 0x26;
      auVar12._20_2_ = 0x26;
      auVar12._22_2_ = 0x26;
      auVar12._24_2_ = 0x26;
      auVar12._26_2_ = 0x26;
      auVar12._28_2_ = 0x26;
      auVar12._30_2_ = 0x26;
      iVar4 = 0;
      auVar15._8_2_ = 0x40;
      auVar15._0_8_ = 0x40004000400040;
      auVar15._10_2_ = 0x40;
      auVar15._12_2_ = 0x40;
      auVar15._14_2_ = 0x40;
      auVar15._16_2_ = 0x40;
      auVar15._18_2_ = 0x40;
      auVar15._20_2_ = 0x40;
      auVar15._22_2_ = 0x40;
      auVar15._24_2_ = 0x40;
      auVar15._26_2_ = 0x40;
      auVar15._28_2_ = 0x40;
      auVar15._30_2_ = 0x40;
      do {
        uVar5 = 0;
        do {
          auVar10 = vpsubw_avx2(*(undefined1 (*) [32])(lVar2 + uVar5 * 2),
                                *(undefined1 (*) [32])(lVar3 + uVar5 * 2));
          auVar10 = vpabsw_avx2(auVar10);
          auVar10 = vpsraw_avx2(auVar10,auVar6);
          auVar10 = vpaddw_avx2(auVar10,auVar12);
          auVar10 = vpmaxsw_avx2(auVar10,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar10 = vpminsw_avx2(auVar10,auVar15);
          auVar1 = vpackuswb_avx(auVar10._0_16_,auVar10._16_16_);
          *(undefined1 (*) [16])(mask + uVar5) = auVar1;
          uVar5 = uVar5 + 0x10;
        } while (uVar5 < (uint)w);
        mask = mask + (uint)w;
        iVar4 = iVar4 + 1;
        lVar3 = lVar3 + (long)src1_stride * 2;
        lVar2 = lVar2 + (long)src0_stride * 2;
      } while (iVar4 != h);
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_avx2(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 16) {
    av1_build_compound_diffwtd_mask_highbd_ssse3(
        mask, mask_type, src0, src0_stride, src1, src1_stride, h, w, bd);
  } else {
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    assert(bd >= 8);
    assert((w % 16) == 0);
    const __m256i y0 = _mm256_setzero_si256();
    const __m256i yAOM_BLEND_A64_MAX_ALPHA =
        _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m256i ymask_base = _mm256_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_srai_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), DIFF_FACTOR_LOG2);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_sub_epi16(yAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_srai_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), DIFF_FACTOR_LOG2);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_sra_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), xshift);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_sub_epi16(yAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 16) {
            __m256i s0 = _mm256_loadu_si256((const __m256i *)&ssrc0[j]);
            __m256i s1 = _mm256_loadu_si256((const __m256i *)&ssrc1[j]);
            __m256i diff = _mm256_sra_epi16(
                _mm256_abs_epi16(_mm256_sub_epi16(s0, s1)), xshift);
            __m256i m = _mm256_min_epi16(
                _mm256_max_epi16(y0, _mm256_add_epi16(diff, ymask_base)),
                yAOM_BLEND_A64_MAX_ALPHA);
            m = _mm256_packus_epi16(m, m);
            m = _mm256_permute4x64_epi64(m, _MM_SHUFFLE(0, 0, 2, 0));
            __m128i m0 = _mm256_castsi256_si128(m);
            _mm_storeu_si128((__m128i *)&mask[j], m0);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}